

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_c(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  REF_STATUS RVar2;
  int local_cc;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell;
  REF_INT nodes [27];
  REF_INT *local_50;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT ixyz;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  ref_node = (REF_NODE)fopen(filename,"w");
  if ((FILE *)ref_node == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (ref_node == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x6a1,
           "ref_export_c","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    uVar1 = ref_node_compact((REF_NODE)ref_cell,&n2o,&local_50);
    if (uVar1 == 0) {
      for (o2n._4_4_ = 0; (int)o2n._4_4_ < (int)ref_cell->type; o2n._4_4_ = o2n._4_4_ + 1) {
        fprintf((FILE *)ref_node,"  RSS(ref_node_add(ref_node,%d,&node),\"node\");\n",
                (ulong)o2n._4_4_);
        for (o2n._0_4_ = 0; (int)(uint)o2n < 3; o2n._0_4_ = (uint)o2n + 1) {
          fprintf((FILE *)ref_node,"  ref_node_xyz(ref_node,%d,node) = %.15e;\n",
                  *(undefined8 *)
                   (ref_cell->c2n + (long)(int)((uint)o2n + local_50[(int)o2n._4_4_] * 0xf) * 2),
                  (ulong)(uint)o2n);
        }
      }
      _ixyz = *(REF_CELL *)(filename_local + 0x40);
      for (local_cc = 0; local_cc < _ixyz->max; local_cc = local_cc + 1) {
        RVar2 = ref_cell_nodes(_ixyz,local_cc,&ref_private_macro_code_rss);
        if (RVar2 == 0) {
          for (o2n._4_4_ = 0; (int)o2n._4_4_ < _ixyz->size_per; o2n._4_4_ = o2n._4_4_ + 1) {
            fprintf((FILE *)ref_node,"  nodes[%d] = %d;\n",(ulong)o2n._4_4_,
                    (ulong)(uint)n2o[(&ref_private_macro_code_rss)[(int)o2n._4_4_]]);
          }
          fprintf((FILE *)ref_node,
                  "  RSS(ref_cell_add(ref_grid_qua(ref_grid),nodes,&cell),\"qua\");\n");
        }
      }
      if (local_50 != (REF_INT *)0x0) {
        free(local_50);
      }
      if (n2o != (REF_INT *)0x0) {
        free(n2o);
      }
      fclose((FILE *)ref_node);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x6a3,"ref_export_c",(ulong)uVar1,"compact");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_c(REF_GRID ref_grid,
                                       const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node, ixyz;
  REF_INT *o2n, *n2o;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++) {
    fprintf(file, "  RSS(ref_node_add(ref_node,%d,&node),\"node\");\n", node);
    for (ixyz = 0; ixyz < 3; ixyz++)
      fprintf(file, "  ref_node_xyz(ref_node,%d,node) = %.15e;\n", ixyz,
              ref_node_xyz(ref_node, ixyz, n2o[node]));
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_size_per(ref_cell); node++)
      fprintf(file, "  nodes[%d] = %d;\n", node, o2n[nodes[node]]);
    fprintf(
        file,
        "  RSS(ref_cell_add(ref_grid_qua(ref_grid),nodes,&cell),\"qua\");\n");
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}